

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C_matrix.h
# Opt level: O2

void __thiscall C_matrix<double>::C_matrix(C_matrix<double> *this,int _L,int _C)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double *pdVar3;
  int iVar4;
  int iVar5;
  double local_40;
  C_matrix<double> local_38;
  
  this->_vptr_C_matrix = (_func_int **)&PTR__C_matrix_00115d68;
  this->m_L = _L;
  this->m_C = _C;
  pdVar3 = allocate(this,_L,_C);
  this->m_A = pdVar3;
  if (pdVar3 == (double *)0x0) {
    this->m_L = 0;
    this->m_C = 0;
    iVar4 = -1;
    iVar5 = -1;
  }
  else {
    uVar1 = this->m_L;
    uVar2 = this->m_C;
    iVar4 = uVar1 + -1;
    iVar5 = uVar2 + -1;
  }
  this->endL = iVar4;
  this->endC = iVar5;
  local_40 = 0.0;
  operator=(&local_38,this,&local_40);
  ~C_matrix(&local_38);
  return;
}

Assistant:

C_matrix<dataType>::C_matrix(int _L, int _C) : m_L(_L),m_C(_C)
{
    m_A = allocate(m_L,m_C);
    if(m_A==NULL)
    {
        m_L=0;
        m_C=0;
    }
    endL = m_L-1;
    endC = m_C-1;
    *this = 0.0;
}